

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

ExpressionSymbol * __thiscall Expression::parseSymbol(Expression *this)

{
  DataType DVar1;
  bool bVar2;
  int iVar3;
  Token TVar4;
  ExpressionSymbol *pEVar5;
  undefined4 extraout_var;
  ExpressionValue *this_00;
  CommandInfo *comm;
  DataBuffer *pDVar6;
  Variable *args_1;
  undefined4 extraout_var_00;
  void *__child_stack;
  void *__child_stack_00;
  __fn *__fn;
  BotscriptParser *pBVar7;
  void *in_R8;
  long lVar8;
  undefined1 uVar9;
  Expression expr;
  String local_68;
  String local_48;
  
  iVar3 = Lexer::position(this->m_lexer);
  bVar2 = Lexer::next(this->m_lexer,Colon);
  if (bVar2) {
    pEVar5 = (ExpressionSymbol *)operator_new(4);
    pEVar5->m_type = EXPRSYM_Colon;
    return pEVar5;
  }
  uVar9 = EXPRSYM_Operator;
  for (lVar8 = 0; lVar8 != 0x150; lVar8 = lVar8 + 0x10) {
    bVar2 = Lexer::next(this->m_lexer,*(Token *)((long)&g_Operators[0].token + lVar8));
    if (bVar2) {
      pEVar5 = (ExpressionSymbol *)operator_new(8);
      pEVar5->m_type = EXPRSYM_Operator;
      *(undefined1 *)&pEVar5[1].m_type = uVar9;
      return pEVar5;
    }
    uVar9 = uVar9 + EXPRSYM_Value;
  }
  bVar2 = Lexer::next(this->m_lexer,ParenStart);
  if (bVar2) {
    iVar3 = (int)(char)this->m_type;
    Expression(&expr,this->m_parser,this->m_lexer,this->m_type);
    __fn = (__fn *)0x14;
    Lexer::mustGetNext(this->m_lexer,ParenEnd);
    iVar3 = ExpressionValue::clone
                      ((ExpressionValue *)
                       *expr.m_symbols._deque.
                        super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur,__fn,__child_stack,iVar3,
                       in_R8);
    this_00 = (ExpressionValue *)CONCAT44(extraout_var,iVar3);
LAB_0011c96d:
    ~Expression(&expr);
    return &this_00->super_ExpressionSymbol;
  }
  this_00 = (ExpressionValue *)operator_new(0x18);
  DVar1 = this->m_type;
  (this_00->super_ExpressionSymbol).m_type = EXPRSYM_Value;
  this_00->m_buffer = (DataBuffer *)0x0;
  this_00->m_valueType = DVar1;
  Lexer::peekNextString(&local_48,this->m_lexer,1);
  comm = findCommandByName(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (comm != (CommandInfo *)0x0) {
    std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::operator+=
              (&this->m_lexer->m_tokenPosition,1);
    if ((this->m_type != TYPE_Unknown) && (comm->returnvalue != this->m_type)) {
      error<String>("%1 returns an incompatible data type",&comm->name);
    }
    pDVar6 = BotscriptParser::parseCommand(this->m_parser,comm);
    this_00->m_buffer = pDVar6;
    return &this_00->super_ExpressionSymbol;
  }
  bVar2 = Lexer::next(this->m_lexer,DollarSign);
  if (bVar2) {
    Lexer::mustGetNext(this->m_lexer,Symbol);
    pBVar7 = this->m_parser;
    getTokenString((String *)&expr,this);
    args_1 = BotscriptParser::findVariable(pBVar7,(String *)&expr);
    std::__cxx11::string::~string((string *)&expr);
    if (args_1 == (Variable *)0x0) {
      getTokenString((String *)&expr,this);
      error<String>("unknown variable %1",(String *)&expr);
      std::__cxx11::string::~string((string *)&expr);
    }
    if (args_1->type != this->m_type) {
      dataTypeName((String *)&expr,this->m_type);
      dataTypeName(&local_68,args_1->type);
      error<String,String,String>
                ("expression requires %1, variable $%2 is of type %3",(String *)&expr,&args_1->name,
                 &local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&expr);
    }
    if (args_1->isarray != true) {
      if (args_1->writelevel == WRITE_Constexpr) {
        this_00->m_value = args_1->value;
        return &this_00->super_ExpressionSymbol;
      }
      pDVar6 = (DataBuffer *)operator_new(0xb8);
      DataBuffer::DataBuffer(pDVar6,8);
      DataBuffer::writeHeader
                (pDVar6,PushLocalVar - (*(args_1->statename)._string._M_dataplus._M_p == '\0'));
      DataBuffer::writeDWord(pDVar6,args_1->index);
      this_00->m_buffer = pDVar6;
      return &this_00->super_ExpressionSymbol;
    }
    Lexer::mustGetNext(this->m_lexer,BracketStart);
    pBVar7 = this->m_parser;
    iVar3 = 2;
    Expression(&expr,pBVar7,this->m_lexer,TYPE_Int);
    ExpressionValue::convertToBuffer
              ((ExpressionValue *)
               *expr.m_symbols._deque.
                super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur);
    iVar3 = DataBuffer::clone(*(DataBuffer **)
                               (*expr.m_symbols._deque.
                                 super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 2),(__fn *)pBVar7
                              ,__child_stack_00,iVar3,in_R8);
    pDVar6 = (DataBuffer *)CONCAT44(extraout_var_00,iVar3);
    DataBuffer::writeHeader(pDVar6,PushGlobalArray);
    DataBuffer::writeDWord(pDVar6,args_1->index);
    this_00->m_buffer = pDVar6;
    Lexer::mustGetNext(this->m_lexer,BracketEnd);
    goto LAB_0011c96d;
  }
  switch(this->m_type) {
  case TYPE_Unknown:
  case TYPE_Void:
    getTokenString((String *)&expr,this);
    error<String>("unknown identifier `%1` (expected keyword, function or variable)",(String *)&expr
                 );
    std::__cxx11::string::~string((string *)&expr);
  default:
switchD_0011cb9c_default:
    Lexer::token(this->m_lexer);
    std::__cxx11::string::_M_assign((string *)&this->m_badTokenText);
    Lexer::setPosition(this->m_lexer,iVar3);
    ExpressionValue::~ExpressionValue(this_00);
    operator_delete(this_00);
    this_00 = (ExpressionValue *)0x0;
    break;
  case TYPE_Int:
    goto switchD_0011cb9c_caseD_2;
  case TYPE_String:
    goto switchD_0011cb9c_caseD_3;
  case TYPE_Bool:
    bVar2 = Lexer::next(this->m_lexer,True);
    if ((bVar2) || (bVar2 = Lexer::next(this->m_lexer,False), bVar2)) {
      TVar4 = Lexer::tokenType(this->m_lexer);
      this_00->m_value = (uint)(TVar4 == True);
      return &this_00->super_ExpressionSymbol;
    }
switchD_0011cb9c_caseD_2:
    bVar2 = Lexer::next(this->m_lexer,Number);
    if (bVar2) {
      getTokenString((String *)&expr,this);
      lVar8 = String::toLong((String *)&expr,(bool *)0x0,10);
      this_00->m_value = (int)lVar8;
    }
    else {
switchD_0011cb9c_caseD_3:
      bVar2 = Lexer::next(this->m_lexer,String);
      if (!bVar2) goto switchD_0011cb9c_default;
      getTokenString((String *)&expr,this);
      iVar3 = getStringTableIndex((String *)&expr);
      this_00->m_value = iVar3;
    }
    std::__cxx11::string::~string((string *)&expr);
  }
  return &this_00->super_ExpressionSymbol;
}

Assistant:

ExpressionSymbol* Expression::parseSymbol()
{
	int pos = m_lexer->position();
	ExpressionValue* op = null;

	if (m_lexer->next (Token::Colon))
		return new ExpressionColon;

	// Check for operator
	for (const OperatorInfo& op : g_Operators)
	{
		if (m_lexer->next (op.token))
			return new ExpressionOperator ((ExpressionOperatorType) (&op - &g_Operators[0]));
	}

	// Check sub-expression
	if (m_lexer->next (Token::ParenStart))
	{
		Expression expr (m_parser, m_lexer, m_type);
		m_lexer->mustGetNext (Token::ParenEnd);
		return expr.getResult()->clone();
	}

	op = new ExpressionValue (m_type);

	// Check function
	if (CommandInfo* comm = findCommandByName (m_lexer->peekNextString()))
	{
		m_lexer->skip();

		if (m_type != TYPE_Unknown and comm->returnvalue != m_type)
			error ("%1 returns an incompatible data type", comm->name);

		op->setBuffer (m_parser->parseCommand (comm));
		return op;
	}

	// Check for variables
	if (m_lexer->next (Token::DollarSign))
	{
		m_lexer->mustGetNext (Token::Symbol);
		Variable* var = m_parser->findVariable (getTokenString());

		if (var == null)
			error ("unknown variable %1", getTokenString());

		if (var->type != m_type)
		{
			error ("expression requires %1, variable $%2 is of type %3",
				dataTypeName (m_type), var->name, dataTypeName (var->type));
		}

		if (var->isarray)
		{
			m_lexer->mustGetNext (Token::BracketStart);
			Expression expr (m_parser, m_lexer, TYPE_Int);
			expr.getResult()->convertToBuffer();
			DataBuffer* buf = expr.getResult()->buffer()->clone();
			buf->writeHeader (DataHeader::PushGlobalArray);
			buf->writeDWord (var->index);
			op->setBuffer (buf);
			m_lexer->mustGetNext (Token::BracketEnd);
		}
		elif (var->writelevel == WRITE_Constexpr)
		{
			op->setValue (var->value);
		}
		else
		{
			DataBuffer* buf = new DataBuffer (8);

			if (var->isGlobal())
				buf->writeHeader (DataHeader::PushGlobalVar);
			else
				buf->writeHeader (DataHeader::PushLocalVar);

			buf->writeDWord (var->index);
			op->setBuffer (buf);
		}

		return op;
	}